

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Peeps.cpp
# Opt level: O2

Instr * __thiscall
Peeps::PeepCondMove(Peeps *this,LabelInstr *labelInstr,Instr *nextInstr,bool isInHelper)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  LabelInstr *pLVar4;
  BranchInstr *pBVar5;
  LabelInstr *this_00;
  undefined4 *puVar6;
  Instr *pIVar7;
  OpCode OVar8;
  
  pLVar4 = labelInstr;
  while (pLVar4 = (LabelInstr *)IR::Instr::GetPrevRealInstrOrLabel(&pLVar4->super_Instr),
        (pLVar4->super_Instr).m_opcode == MOV) {
    bVar2 = IR::Opnd::IsRegOpnd((pLVar4->super_Instr).m_src1);
    if (!bVar2) {
      return nextInstr;
    }
    bVar2 = IR::Opnd::IsRegOpnd((pLVar4->super_Instr).m_dst);
    if (!bVar2) {
      return nextInstr;
    }
  }
  if ((pLVar4->super_Instr).m_kind == InstrKindBranch) {
    pBVar5 = IR::Instr::AsBranchInstr((Instr *)pLVar4);
    bVar2 = IR::BranchInstr::IsConditional(pBVar5);
    if (bVar2) {
      pBVar5 = IR::Instr::AsBranchInstr((Instr *)pLVar4);
      bVar2 = IR::BranchInstr::IsMultiBranch(pBVar5);
      if (((!bVar2) &&
          (pBVar5 = IR::Instr::AsBranchInstr((Instr *)pLVar4), pBVar5->m_branchTarget == labelInstr)
          ) && ((pLVar4->super_Instr).m_opcode != Leave)) {
        this_00 = (LabelInstr *)IR::Instr::AsBranchInstr((Instr *)pLVar4);
        uVar3 = *(int *)&(this_00->super_Instr).m_opcode - 0x41d;
        pLVar4 = this_00;
        if (((ushort)uVar3 < 0x11) && ((0x1fdffU >> (uVar3 & 0x1f) & 1) != 0)) {
          OVar8 = *(OpCode *)(&DAT_00e93bf0 + (ulong)(uVar3 & 0xffff) * 2);
        }
        else {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar6 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Peeps.cpp"
                             ,0x4dd,"((0))","UNREACHED");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *puVar6 = 0;
          OVar8 = InvalidOpCode;
        }
        while (pLVar4 = (LabelInstr *)IR::Instr::GetNextRealInstrOrLabel(&pLVar4->super_Instr),
              pLVar4 != labelInstr) {
          (pLVar4->super_Instr).m_opcode = OVar8;
        }
        IR::Instr::Remove((Instr *)this_00);
        if (((SListCounted<IR::BranchInstr_*,_Memory::ArenaAllocator> *)
             (labelInstr->labelRefs).
             super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
             super_SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
             super_SListNodeBase<Memory::ArenaAllocator>.next == &labelInstr->labelRefs) &&
           ((labelInstr->field_0x78 & 4) == 0)) {
          pIVar7 = PeepUnreachableLabel(labelInstr,isInHelper,(bool *)0x0);
          return pIVar7;
        }
      }
    }
  }
  return nextInstr;
}

Assistant:

IR::Instr*
Peeps::PeepCondMove(IR::LabelInstr *labelInstr, IR::Instr *nextInstr, const bool isInHelper)
{
    IR::Instr *instr = labelInstr->GetPrevRealInstrOrLabel();

    Js::OpCode newOpCode = Js::OpCode::InvalidOpCode;

    // Check if BB is all MOVs with both RegOpnd
    while(instr->m_opcode == Js::OpCode::MOV)
    {
        if (!instr->GetSrc1()->IsRegOpnd() || !instr->GetDst()->IsRegOpnd())
            return nextInstr;
        instr = instr->GetPrevRealInstrOrLabel();
    }

    // Did we hit a conditional branch ?
    if (instr->IsBranchInstr() && instr->AsBranchInstr()->IsConditional() &&
        !instr->AsBranchInstr()->IsMultiBranch() &&
        instr->AsBranchInstr()->GetTarget() == labelInstr &&
        instr->m_opcode != Js::OpCode::Leave)
    {
        IR::BranchInstr *brInstr = instr->AsBranchInstr();

        // Get the correct CMOVcc
        switch(brInstr->m_opcode)
        {
        case Js::OpCode::JA:
                newOpCode = Js::OpCode::CMOVBE;
                break;
        case Js::OpCode::JAE:
                newOpCode = Js::OpCode::CMOVB;
                break;
        case Js::OpCode::JB:
                newOpCode = Js::OpCode::CMOVAE;
                break;
        case Js::OpCode::JBE:
                newOpCode = Js::OpCode::CMOVA;
                break;
        case Js::OpCode::JEQ:
                newOpCode = Js::OpCode::CMOVNE;
                break;
        case Js::OpCode::JNE:
                newOpCode = Js::OpCode::CMOVE;
                break;
        case Js::OpCode::JNP:
                newOpCode = Js::OpCode::CMOVP;
                break;
        case Js::OpCode::JLT:
                newOpCode = Js::OpCode::CMOVGE;
                break;
        case Js::OpCode::JLE:
                newOpCode = Js::OpCode::CMOVG;
                break;
        case Js::OpCode::JGT:
                newOpCode = Js::OpCode::CMOVLE;
                break;
        case Js::OpCode::JGE:
                newOpCode = Js::OpCode::CMOVL;
                break;
        case Js::OpCode::JNO:
                newOpCode = Js::OpCode::CMOVO;
                break;
        case Js::OpCode::JO:
                newOpCode = Js::OpCode::CMOVNO;
                break;
        case Js::OpCode::JP:
                newOpCode = Js::OpCode::CMOVNP;
                break;
        case Js::OpCode::JNSB:
                newOpCode = Js::OpCode::CMOVS;
                break;
        case Js::OpCode::JSB:
                newOpCode = Js::OpCode::CMOVNS;
                break;
        default:
                Assert(UNREACHED);
                __assume(UNREACHED);
        }

        // convert the entire block to CMOVs
        instr = brInstr->GetNextRealInstrOrLabel();
        while(instr != labelInstr)
        {
            instr->m_opcode = newOpCode;
            instr = instr->GetNextRealInstrOrLabel();
        }

        // remove the Jcc
        brInstr->Remove();
        // We may have exposed an unreachable label by deleting the branch
        if (labelInstr->IsUnreferenced())
           return Peeps::PeepUnreachableLabel(labelInstr, isInHelper);
    }
    return nextInstr;
}